

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

ssize_t uv__fs_lutime(uv_fs_t *req)

{
  int iVar1;
  timespec tVar2;
  __time_t local_58;
  __syscall_slong_t local_50;
  __time_t local_48;
  __syscall_slong_t local_40;
  undefined1 local_38 [8];
  timespec ts [2];
  uv_fs_t *req_local;
  
  tVar2 = uv__fs_to_timespec(req->atime);
  local_48 = tVar2.tv_sec;
  local_38 = (undefined1  [8])local_48;
  local_40 = tVar2.tv_nsec;
  ts[0].tv_sec = local_40;
  tVar2 = uv__fs_to_timespec(req->mtime);
  local_58 = tVar2.tv_sec;
  ts[0].tv_nsec = local_58;
  local_50 = tVar2.tv_nsec;
  ts[1].tv_sec = local_50;
  iVar1 = utimensat(-100,req->path,(timespec *)local_38,0x100);
  return (long)iVar1;
}

Assistant:

static ssize_t uv__fs_lutime(uv_fs_t* req) {
#if defined(__linux__)            ||                                           \
    defined(_AIX71)               ||                                           \
    defined(__sun)                ||                                           \
    defined(__HAIKU__)            ||                                           \
    defined(__GNU__)              ||                                           \
    defined(__OpenBSD__)
  struct timespec ts[2];
  ts[0] = uv__fs_to_timespec(req->atime);
  ts[1] = uv__fs_to_timespec(req->mtime);
  return utimensat(AT_FDCWD, req->path, ts, AT_SYMLINK_NOFOLLOW);
#elif defined(__APPLE__)          ||                                          \
      defined(__DragonFly__)      ||                                          \
      defined(__FreeBSD__)        ||                                          \
      defined(__NetBSD__)
  struct timeval tv[2];
  tv[0] = uv__fs_to_timeval(req->atime);
  tv[1] = uv__fs_to_timeval(req->mtime);
  return lutimes(req->path, tv);
#else
  errno = ENOSYS;
  return -1;
#endif
}